

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode.c
# Opt level: O2

int CVodeInit(void *cvode_mem,CVRhsFn f,sunrealtype t0,N_Vector y0)

{
  N_Vector_Ops p_Var1;
  int iVar2;
  long lVar3;
  long lVar4;
  SUNNonlinearSolver NLS;
  long lVar5;
  int error_code;
  char *msgfmt;
  undefined8 *puVar6;
  sunindextype liw1;
  sunindextype lrw1;
  
  if (cvode_mem == (void *)0x0) {
    msgfmt = "cvode_mem = NULL illegal.";
    error_code = -0x15;
    cvode_mem = (CVodeMem)0x0;
    iVar2 = 0x17d;
    goto LAB_00109e89;
  }
  if (y0 == (N_Vector)0x0) {
    msgfmt = "y0 = NULL illegal.";
    error_code = -0x16;
    iVar2 = 0x188;
    goto LAB_00109e89;
  }
  if (f == (CVRhsFn)0x0) {
    msgfmt = "f = NULL illegal.";
    error_code = -0x16;
    iVar2 = 400;
    goto LAB_00109e89;
  }
  p_Var1 = y0->ops;
  if (((((p_Var1->nvclone == (_func_N_Vector_N_Vector *)0x0) ||
        (p_Var1->nvdestroy == (_func_void_N_Vector *)0x0)) ||
       (p_Var1->nvlinearsum == (_func_void_sunrealtype_N_Vector_sunrealtype_N_Vector_N_Vector *)0x0)
       ) || ((((p_Var1->nvconst == (_func_void_sunrealtype_N_Vector *)0x0 ||
               (p_Var1->nvprod == (_func_void_N_Vector_N_Vector_N_Vector *)0x0)) ||
              ((p_Var1->nvdiv == (_func_void_N_Vector_N_Vector_N_Vector *)0x0 ||
               ((p_Var1->nvscale == (_func_void_sunrealtype_N_Vector_N_Vector *)0x0 ||
                (p_Var1->nvabs == (_func_void_N_Vector_N_Vector *)0x0)))))) ||
             (p_Var1->nvinv == (_func_void_N_Vector_N_Vector *)0x0)))) ||
     (((p_Var1->nvaddconst == (_func_void_N_Vector_sunrealtype_N_Vector *)0x0 ||
       (p_Var1->nvmaxnorm == (_func_sunrealtype_N_Vector *)0x0)) ||
      (p_Var1->nvwrmsnorm == (_func_sunrealtype_N_Vector_N_Vector *)0x0)))) {
    msgfmt = "A required vector operation is not implemented.";
    error_code = -0x16;
    iVar2 = 0x19b;
    goto LAB_00109e89;
  }
  if (p_Var1->nvspace == (_func_void_N_Vector_sunindextype_ptr_sunindextype_ptr *)0x0) {
    lrw1 = 0;
    liw1 = 0;
  }
  else {
    N_VSpace(y0,&lrw1,&liw1);
  }
  *(sunindextype *)((long)cvode_mem + 0x3b0) = lrw1;
  *(sunindextype *)((long)cvode_mem + 0x3b8) = liw1;
  lVar3 = N_VClone(y0);
  *(long *)((long)cvode_mem + 200) = lVar3;
  if (lVar3 != 0) {
    lVar3 = N_VClone(y0);
    *(long *)((long)cvode_mem + 0xd8) = lVar3;
    puVar6 = (undefined8 *)((long)cvode_mem + 200);
    if (lVar3 != 0) {
      lVar3 = N_VClone(y0);
      *(long *)((long)cvode_mem + 0xe0) = lVar3;
      if (lVar3 != 0) {
        lVar3 = N_VClone(y0);
        *(long *)((long)cvode_mem + 0xe8) = lVar3;
        if (lVar3 != 0) {
          lVar3 = N_VClone(y0);
          *(long *)((long)cvode_mem + 0xf0) = lVar3;
          if (lVar3 != 0) {
            lVar3 = N_VClone(y0);
            *(long *)((long)cvode_mem + 0xf8) = lVar3;
            if (lVar3 != 0) {
              lVar3 = N_VClone(y0);
              *(long *)((long)cvode_mem + 0x100) = lVar3;
              if (lVar3 != 0) {
                lVar3 = 0;
                while( true ) {
                  iVar2 = *(int *)((long)cvode_mem + 0x2c8);
                  if (iVar2 < lVar3) {
                    lVar3 = (long)iVar2 + 8;
                    *(long *)((long)cvode_mem + 0x3c0) =
                         *(long *)((long)cvode_mem + 0x3c0) +
                         *(long *)((long)cvode_mem + 0x3b0) * lVar3;
                    *(long *)((long)cvode_mem + 0x3c8) =
                         *(long *)((long)cvode_mem + 0x3c8) +
                         lVar3 * *(long *)((long)cvode_mem + 0x3b8);
                    *(int *)((long)cvode_mem + 0x460) = iVar2;
                    *(CVRhsFn *)((long)cvode_mem + 0x10) = f;
                    *(sunrealtype *)((long)cvode_mem + 0x168) = t0;
                    N_VScale(0,y0,*(undefined8 *)((long)cvode_mem + 0x60));
                    NLS = SUNNonlinSol_Newton(y0,*cvode_mem);
                    if (NLS == (SUNNonlinearSolver)0x0) {
                      cvProcessError((CVodeMem)cvode_mem,-0x14,0x1c6,"CVodeInit",
                                     "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvode/cvode.c"
                                     ,"A memory request failed.");
                      cvFreeVectors((CVodeMem)cvode_mem);
                      return -0x14;
                    }
                    iVar2 = CVodeSetNonlinearSolver(cvode_mem,NLS);
                    if (iVar2 != 0) {
                      cvProcessError((CVodeMem)cvode_mem,iVar2,0x1d3,"CVodeInit",
                                     "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvode/cvode.c"
                                     ,"Setting the nonlinear solver failed");
                      cvFreeVectors((CVodeMem)cvode_mem);
                      SUNNonlinSolFree(NLS);
                      return -0x14;
                    }
                    *(undefined4 *)((long)cvode_mem + 0x3d8) = 1;
                    *(undefined4 *)((long)cvode_mem + 0x120) = 1;
                    *(undefined4 *)((long)cvode_mem + 0x130) = 2;
                    *(undefined8 *)((long)cvode_mem + 0x2f8) =
                         *(undefined8 *)((long)cvode_mem + 0x310);
                    *(undefined4 *)((long)cvode_mem + 0x428) = 0;
                    *(undefined8 *)((long)cvode_mem + 0x440) = 0;
                    *(undefined8 *)((long)cvode_mem + 0x458) = 0x3ff0000000000000;
                    *(undefined4 *)((long)cvode_mem + 0x550) = 0;
                    *(undefined8 *)((long)cvode_mem + 0x5c8) = 0;
                    *(undefined4 *)((long)cvode_mem + 0x5c4) = 0;
                    *(undefined8 *)((long)cvode_mem + 0x150) = 0;
                    *(undefined8 *)((long)cvode_mem + 0x128) = 0x200000000;
                    *(undefined8 *)((long)cvode_mem + 0x558) = 0;
                    lVar3 = (long)cvode_mem + 0x490;
                    *(undefined8 *)((long)cvode_mem + 0x358) = 0;
                    *(undefined8 *)((long)cvode_mem + 0x360) = 0;
                    *(undefined8 *)((long)cvode_mem + 0x368) = 0;
                    *(undefined8 *)((long)cvode_mem + 0x370) = 0;
                    *(undefined8 *)((long)cvode_mem + 0x378) = 0;
                    *(undefined8 *)((long)cvode_mem + 0x380) = 0;
                    *(undefined8 *)((long)cvode_mem + 900) = 0;
                    *(undefined8 *)((long)cvode_mem + 0x38c) = 0;
                    *(undefined8 *)((long)cvode_mem + 0x410) = 0;
                    *(undefined8 *)((long)cvode_mem + 0x400) = 0;
                    *(undefined8 *)((long)cvode_mem + 0x408) = 0;
                    *(undefined8 *)((long)cvode_mem + 0x3f0) = 0;
                    *(undefined8 *)((long)cvode_mem + 0x3f8) = 0;
                    *(undefined8 *)((long)cvode_mem + 0x430) = 0;
                    *(undefined8 *)((long)cvode_mem + 0x438) = 0;
                    for (lVar4 = 1; lVar4 != 6; lVar4 = lVar4 + 1) {
                      for (lVar5 = 0; lVar5 != 3; lVar5 = lVar5 + 1) {
                        *(undefined8 *)(lVar3 + lVar5 * 8) = 0;
                      }
                      lVar3 = lVar3 + 0x20;
                    }
                    *(undefined4 *)((long)cvode_mem + 0x46c) = 1;
                    return 0;
                  }
                  lVar4 = N_VClone(y0);
                  *(long *)((long)cvode_mem + lVar3 * 8 + 0x60) = lVar4;
                  if (lVar4 == 0) break;
                  lVar3 = lVar3 + 1;
                }
                N_VDestroy(*(undefined8 *)((long)cvode_mem + 200));
                N_VDestroy(*(undefined8 *)((long)cvode_mem + 0xd8));
                N_VDestroy(*(undefined8 *)((long)cvode_mem + 0xe0));
                N_VDestroy(*(undefined8 *)((long)cvode_mem + 0xe8));
                N_VDestroy(*(undefined8 *)((long)cvode_mem + 0xf0));
                N_VDestroy(*(undefined8 *)((long)cvode_mem + 0xf8));
                N_VDestroy(*(undefined8 *)((long)cvode_mem + 0x100));
                for (lVar4 = 0; lVar3 != lVar4; lVar4 = lVar4 + 1) {
                  N_VDestroy(*(undefined8 *)((long)cvode_mem + lVar4 * 8 + 0x60));
                }
                goto LAB_00109fdd;
              }
              N_VDestroy(*(undefined8 *)((long)cvode_mem + 0xf8));
            }
            N_VDestroy(*(undefined8 *)((long)cvode_mem + 0xf0));
          }
          N_VDestroy(*(undefined8 *)((long)cvode_mem + 0xe8));
        }
        N_VDestroy(*(undefined8 *)((long)cvode_mem + 0xe0));
      }
      puVar6 = (undefined8 *)((long)cvode_mem + 0xd8);
      N_VDestroy(*(undefined8 *)((long)cvode_mem + 200));
    }
    N_VDestroy(*puVar6);
  }
LAB_00109fdd:
  msgfmt = "A memory request failed.";
  error_code = -0x14;
  iVar2 = 0x1b1;
LAB_00109e89:
  cvProcessError((CVodeMem)cvode_mem,error_code,iVar2,"CVodeInit",
                 "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvode/cvode.c"
                 ,msgfmt);
  return error_code;
}

Assistant:

int CVodeInit(void* cvode_mem, CVRhsFn f, sunrealtype t0, N_Vector y0)
{
  CVodeMem cv_mem;
  sunbooleantype nvectorOK, allocOK;
  sunindextype lrw1, liw1;
  int i, k, retval;
  SUNNonlinearSolver NLS;

  /* Check cvode_mem */

  if (cvode_mem == NULL)
  {
    cvProcessError(NULL, CV_MEM_NULL, __LINE__, __func__, __FILE__, MSGCV_NO_MEM);
    return (CV_MEM_NULL);
  }
  cv_mem = (CVodeMem)cvode_mem;

  SUNDIALS_MARK_FUNCTION_BEGIN(CV_PROFILER);

  /* Check for legal input parameters */

  if (y0 == NULL)
  {
    cvProcessError(cv_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                   MSGCV_NULL_Y0);
    SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
    return (CV_ILL_INPUT);
  }

  if (f == NULL)
  {
    cvProcessError(cv_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                   MSGCV_NULL_F);
    SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
    return (CV_ILL_INPUT);
  }

  /* Test if all required vector operations are implemented */

  nvectorOK = cvCheckNvector(y0);
  if (!nvectorOK)
  {
    cvProcessError(cv_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                   MSGCV_BAD_NVECTOR);
    SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
    return (CV_ILL_INPUT);
  }

  /* Set space requirements for one N_Vector */

  if (y0->ops->nvspace != NULL) { N_VSpace(y0, &lrw1, &liw1); }
  else
  {
    lrw1 = 0;
    liw1 = 0;
  }
  cv_mem->cv_lrw1 = lrw1;
  cv_mem->cv_liw1 = liw1;

  /* Allocate the vectors (using y0 as a template) */

  allocOK = cvAllocVectors(cv_mem, y0);
  if (!allocOK)
  {
    cvProcessError(cv_mem, CV_MEM_FAIL, __LINE__, __func__, __FILE__,
                   MSGCV_MEM_FAIL);
    SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
    return (CV_MEM_FAIL);
  }

  /* Input checks complete at this point and history array allocated */

  /* Copy the input parameters into CVODE state */
  cv_mem->cv_f  = f;
  cv_mem->cv_tn = t0;

  /* Initialize zn[0] in the history array */
  N_VScale(ONE, y0, cv_mem->cv_zn[0]);

  /* create a Newton nonlinear solver object by default */
  NLS = SUNNonlinSol_Newton(y0, cv_mem->cv_sunctx);

  /* check that nonlinear solver is non-NULL */
  if (NLS == NULL)
  {
    cvProcessError(cv_mem, CV_MEM_FAIL, __LINE__, __func__, __FILE__,
                   MSGCV_MEM_FAIL);
    cvFreeVectors(cv_mem);
    SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
    return (CV_MEM_FAIL);
  }

  /* attach the nonlinear solver to the CVODE memory */
  retval = CVodeSetNonlinearSolver(cv_mem, NLS);

  /* check that the nonlinear solver was successfully attached */
  if (retval != CV_SUCCESS)
  {
    cvProcessError(cv_mem, retval, __LINE__, __func__, __FILE__,
                   "Setting the nonlinear solver failed");
    cvFreeVectors(cv_mem);
    SUNNonlinSolFree(NLS);
    SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
    return (CV_MEM_FAIL);
  }

  /* set ownership flag */
  cv_mem->ownNLS = SUNTRUE;

  /* All error checking is complete at this point */

  /* Set step parameters */

  cv_mem->cv_q      = 1;
  cv_mem->cv_L      = 2;
  cv_mem->cv_qwait  = cv_mem->cv_L;
  cv_mem->cv_etamax = cv_mem->cv_eta_max_fs;

  cv_mem->cv_qu    = 0;
  cv_mem->cv_hu    = ZERO;
  cv_mem->cv_tolsf = ONE;

  /* Set the linear solver addresses to NULL.
     (We check != NULL later, in CVode) */

  cv_mem->cv_linit  = NULL;
  cv_mem->cv_lsetup = NULL;
  cv_mem->cv_lsolve = NULL;
  cv_mem->cv_lfree  = NULL;
  cv_mem->cv_lmem   = NULL;

  /* Initialize all the counters */

  cv_mem->cv_nst     = 0;
  cv_mem->cv_nfe     = 0;
  cv_mem->cv_ncfn    = 0;
  cv_mem->cv_netf    = 0;
  cv_mem->cv_nni     = 0;
  cv_mem->cv_nnf     = 0;
  cv_mem->cv_nsetups = 0;
  cv_mem->cv_nhnil   = 0;
  cv_mem->cv_nstlp   = 0;
  cv_mem->cv_nscon   = 0;
  cv_mem->cv_nge     = 0;

  cv_mem->cv_irfnd = 0;

  /* Initialize other integrator optional outputs */

  cv_mem->cv_h0u    = ZERO;
  cv_mem->cv_next_h = ZERO;
  cv_mem->cv_next_q = 0;

  /* Initialize Stablilty Limit Detection data */
  /* NOTE: We do this even if stab lim det was not
     turned on yet. This way, the user can turn it
     on at any time */

  cv_mem->cv_nor = 0;
  for (i = 1; i <= 5; i++)
  {
    for (k = 1; k <= 3; k++) { cv_mem->cv_ssdat[i - 1][k - 1] = ZERO; }
  }

  /* Problem has been successfully initialized */

  cv_mem->cv_MallocDone = SUNTRUE;

  SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
  return (CV_SUCCESS);
}